

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_cell_query_base.h
# Opt level: O1

void __thiscall
S2ClosestCellQueryBase<S2MinDistance>::S2ClosestCellQueryBase
          (S2ClosestCellQueryBase<S2MinDistance> *this)

{
  allocator<S2CellIndex::LabelledCell> local_34;
  equal_to<S2CellIndex::LabelledCell> local_33;
  LabelledCellHash local_32;
  SetKey local_31;
  LabelledCell local_30;
  
  (this->index_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->distance_limit_).super_S1ChordAngle.length2_ = 0.0;
  (this->index_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->index_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_30,INFINITY);
  (this->result_singleton_).distance_.super_S1ChordAngle.length2_ = (double)local_30.cell_id.id_;
  (this->result_singleton_).cell_id_.id_ = 0;
  (this->result_singleton_).label_ = -1;
  (this->result_vector_).
  super__Vector_base<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->result_vector_).
  super__Vector_base<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->result_vector_).
  super__Vector_base<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->result_set_).
  super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
  .
  super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
  .tree_.root_.
  super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
  .
  super_Storage<absl::container_internal::CompressedTuple<std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>_*>,_2UL,_false>
  .value = (T)0x0;
  (this->result_set_).
  super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
  .
  super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
  .tree_.rightmost_ = (node_type *)0x0;
  (this->result_set_).
  super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
  .
  super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
  .tree_.size_ = 0;
  gtl::
  dense_hashtable<S2CellIndex::LabelledCell,_S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_gtl::dense_hash_set<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>::Identity,_gtl::dense_hash_set<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>::SetKey,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>
  ::dense_hashtable(&(this->tested_cells_).rep,1,&local_32,&local_33,(Identity *)&local_30,&local_31
                    ,&local_34);
  (this->queue_).c.allocator_and_tag_.tag_.size_ = 0;
  (this->contents_it_).node_.cell_id.id_ = 0;
  (this->contents_it_).cell_tree_ =
       (vector<S2CellIndex::CellNode,_std::allocator<S2CellIndex::CellNode>_> *)0x0;
  (this->contents_it_).prev_start_id_.id_ = 0;
  (this->contents_it_).node_.label = -1;
  (this->contents_it_).node_.parent = -1;
  (this->max_distance_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->max_distance_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->max_distance_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->intersection_with_max_distance_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->intersection_with_max_distance_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->intersection_with_max_distance_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_30.cell_id.id_ = 0;
  local_30.label = -1;
  gtl::
  dense_hashtable<S2CellIndex::LabelledCell,_S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_gtl::dense_hash_set<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>::Identity,_gtl::dense_hash_set<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>::SetKey,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>
  ::set_empty_key(&(this->tested_cells_).rep,&local_30);
  return;
}

Assistant:

S2ClosestCellQueryBase<Distance>::S2ClosestCellQueryBase()
    : tested_cells_(1) /* expected_max_elements*/ {
  tested_cells_.set_empty_key(LabelledCell(S2CellId::None(), -1));
}